

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atom.cpp
# Opt level: O2

void __thiscall r_code::Atom::trace(Atom *this)

{
  ushort uVar1;
  uint uVar2;
  byte bVar3;
  uint uVar4;
  char *pcVar5;
  ostream *poVar6;
  uint8_t i;
  long lVar7;
  bool bVar8;
  string s;
  char *local_40;
  undefined8 local_38;
  char local_30 [16];
  
  write_indents(this);
  switch(this->atom >> 0x18) {
  case 0x80:
    poVar6 = (ostream *)&std::cout;
    pcVar5 = "nil";
    break;
  case 0x81:
    poVar6 = std::operator<<((ostream *)&std::cout,"bl: ");
    *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
         *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) | 1;
    std::ostream::_M_insert<bool>(SUB81(poVar6,0));
    return;
  case 0x82:
    poVar6 = (ostream *)&std::cout;
    pcVar5 = ":";
    break;
  case 0x83:
    poVar6 = (ostream *)&std::cout;
    pcVar5 = "::";
    break;
  case 0x84:
    pcVar5 = "iptr: ";
    goto LAB_00107150;
  case 0x85:
    pcVar5 = "rptr: ";
    goto LAB_00107150;
  case 0x86:
    pcVar5 = "vlptr: ";
    goto LAB_00107150;
  case 0x87:
    pcVar5 = "ipgm_ptr: ";
    goto LAB_00107150;
  case 0x88:
    pcVar5 = "in_obj_ptr: ";
    goto LAB_0010717a;
  case 0x89:
    pcVar5 = "value_ptr: ";
    goto LAB_00107150;
  case 0x8a:
    pcVar5 = "prod_ptr: ";
    goto LAB_00107150;
  case 0x8b:
    pcVar5 = "out_obj_ptr: ";
LAB_00107150:
    poVar6 = std::operator<<((ostream *)&std::cout,pcVar5);
    *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
         *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 2;
LAB_001071b3:
    uVar1 = (ushort)this->atom;
LAB_001071ba:
    std::ostream::operator<<(poVar6,uVar1 & 0xfff);
    return;
  case 0x8c:
    pcVar5 = "d_in_obj_ptr: ";
LAB_0010717a:
    poVar6 = std::operator<<((ostream *)&std::cout,pcVar5);
    *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
         *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
LAB_001071a4:
    poVar6 = std::operator<<(poVar6," ");
    goto LAB_001071b3;
  case 0x8d:
    poVar6 = std::operator<<((ostream *)&std::cout,"assign_ptr: ");
    *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
         *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(ushort)*(byte *)((long)&this->atom + 2));
    goto LAB_001071a4;
  default:
    if (Timestamp_data != '\0') {
      Timestamp_data = Timestamp_data + -1;
      poVar6 = (ostream *)&std::cout;
      goto LAB_001073f8;
    }
    if (String_data != '\0') {
      String_data = String_data + -1;
      local_40 = local_30;
      local_38 = 0;
      local_30[0] = '\0';
      lVar7 = 0;
      while ((lVar7 != 4 && (bVar8 = Char_count != '\0', Char_count = Char_count + -1, bVar8))) {
        std::__cxx11::string::push_back((char)&local_40);
        lVar7 = lVar7 + 1;
      }
      std::operator<<((ostream *)&std::cout,local_40);
      std::__cxx11::string::~string((string *)&local_40);
      return;
    }
    poVar6 = (ostream *)&std::cout;
    if (-1 < (int)this->atom) {
      poVar6 = std::operator<<((ostream *)&std::cout,"nb: ");
      *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
           *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 2;
      std::ostream::operator<<(poVar6,(float)(this->atom * 2));
      return;
    }
    pcVar5 = "undef";
    break;
  case 0x90:
    poVar6 = (ostream *)&std::cout;
    pcVar5 = "this";
    break;
  case 0x91:
    poVar6 = (ostream *)&std::cout;
    pcVar5 = "view";
    break;
  case 0x92:
    poVar6 = (ostream *)&std::cout;
    pcVar5 = "mks";
    break;
  case 0x93:
    poVar6 = (ostream *)&std::cout;
    pcVar5 = "vws";
    break;
  case 0xa0:
    poVar6 = std::operator<<((ostream *)&std::cout,"nid: ");
    *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
         *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 2;
    goto LAB_001073f8;
  case 0xa1:
    poVar6 = std::operator<<((ostream *)&std::cout,"did: ");
    *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
         *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    poVar6 = std::operator<<(poVar6," ");
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    poVar6 = std::operator<<(poVar6," ");
LAB_001073f8:
    std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    return;
  case 0xa2:
    poVar6 = std::operator<<((ostream *)&std::cout,"fid: ");
    *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
         *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 2;
    uVar1 = (ushort)(this->atom >> 8);
    goto LAB_001071ba;
  case 0xc0:
    pcVar5 = "cptr: ";
    goto LAB_00106f92;
  case 0xc1:
    pcVar5 = "set: ";
LAB_00106f92:
    poVar6 = std::operator<<((ostream *)&std::cout,pcVar5);
    *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
         *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 2;
    goto LAB_00107327;
  case 0xc2:
    pcVar5 = "s_set: ";
    goto LAB_001072eb;
  case 0xc3:
    pcVar5 = "obj: ";
    goto LAB_001072eb;
  case 0xc4:
    pcVar5 = "mk: ";
    goto LAB_001072eb;
  case 0xc5:
    pcVar5 = "op: ";
    goto LAB_001072eb;
  case 0xc6:
    poVar6 = std::operator<<((ostream *)&std::cout,"st: ");
    *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
         *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 2;
    uVar2 = this->atom;
    uVar4 = (uVar2 >> 0x18) - 0xc0;
    if (uVar4 < 0xf) {
      if ((0x7f3fU >> (uVar4 & 0x1f) & 1) == 0) {
        bVar3 = 2;
        if (uVar4 != 6) goto LAB_0010728c;
        uVar2 = uVar2 >> 8;
      }
      bVar3 = (byte)uVar2;
    }
    else {
      bVar3 = 0;
    }
LAB_0010728c:
    std::ostream::operator<<(poVar6,(ushort)bVar3);
    uVar2 = this->atom;
    uVar4 = (uVar2 >> 0x18) - 0xc0;
    Char_count = (char)uVar2;
    if (0xe < uVar4) {
      Members_to_go = 0;
      String_data = 0;
      return;
    }
    if ((0x7f3fU >> (uVar4 & 0x1f) & 1) != 0) {
      Members_to_go = Char_count;
      String_data = Char_count;
      return;
    }
    if (uVar4 != 6) {
      Members_to_go = 2;
      String_data = 2;
      return;
    }
    Members_to_go = (undefined1)(uVar2 >> 8);
    String_data = Members_to_go;
    return;
  case 199:
    std::operator<<((ostream *)&std::cout,"us");
    Members_to_go = 2;
    Timestamp_data = 2;
    return;
  case 200:
    pcVar5 = "grp: ";
    goto LAB_001072eb;
  case 0xc9:
  case 0xcb:
  case 0xcc:
    pcVar5 = "ipgm: ";
    goto LAB_001072eb;
  case 0xcd:
    pcVar5 = "cst: ";
    goto LAB_001072eb;
  case 0xce:
    pcVar5 = "mdl: ";
LAB_001072eb:
    poVar6 = std::operator<<((ostream *)&std::cout,pcVar5);
    *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
         *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(ushort)(this->atom >> 8) & 0xfff);
    poVar6 = std::operator<<(poVar6," ");
LAB_00107327:
    uVar2 = this->atom;
    uVar4 = (uVar2 >> 0x18) - 0xc0;
    if (uVar4 < 0xf) {
      if ((0x7f3fU >> (uVar4 & 0x1f) & 1) == 0) {
        bVar3 = 2;
        if (uVar4 != 6) goto LAB_00107349;
        uVar2 = uVar2 >> 8;
      }
      bVar3 = (byte)uVar2;
    }
    else {
      bVar3 = 0;
    }
LAB_00107349:
    std::ostream::operator<<(poVar6,(ushort)bVar3);
    uVar2 = this->atom;
    uVar4 = (uVar2 >> 0x18) - 0xc0;
    if (uVar4 < 0xf) {
      if ((0x7f3fU >> (uVar4 & 0x1f) & 1) == 0) {
        if (uVar4 != 6) {
          Members_to_go = 2;
          return;
        }
        uVar2 = uVar2 >> 8;
      }
      Members_to_go = (undefined1)uVar2;
    }
    else {
      Members_to_go = 0;
    }
    return;
  case 0xcf:
    poVar6 = std::operator<<((ostream *)&std::cout,"null pgm ");
    pcVar5 = "all inputs";
    if ((this->atom & 1) == 0) {
      pcVar5 = "new inputs";
    }
  }
  std::operator<<(poVar6,pcVar5);
  return;
}

Assistant:

void Atom::trace() const
{
    write_indents();

    switch (getDescriptor()) {
    case NIL:
        std::cout << "nil";
        return;

    case BOOLEAN_:
        std::cout << "bl: " << std::boolalpha << asBoolean();
        return;

    case WILDCARD:
        std::cout << ":";
        return;

    case T_WILDCARD:
        std::cout << "::";
        return;

    case I_PTR:
        std::cout << "iptr: " << std::dec << asIndex();
        return;

    case VL_PTR:
        std::cout << "vlptr: " << std::dec << asIndex();
        return;

    case R_PTR:
        std::cout << "rptr: " << std::dec << asIndex();
        return;

    case IPGM_PTR:
        std::cout << "ipgm_ptr: " << std::dec << asIndex();
        return;

    case IN_OBJ_PTR:
        std::cout << "in_obj_ptr: " << std::dec << (uint32_t)asInputIndex() << " " << asIndex();
        return;

    case D_IN_OBJ_PTR:
        std::cout << "d_in_obj_ptr: " << std::dec << (uint32_t)asRelativeIndex() << " " << asIndex();
        return;

    case OUT_OBJ_PTR:
        std::cout << "out_obj_ptr: " << std::dec << asIndex();
        return;

    case VALUE_PTR:
        std::cout << "value_ptr: " << std::dec << asIndex();
        return;

    case PROD_PTR:
        std::cout << "prod_ptr: " << std::dec << asIndex();
        return;

    case ASSIGN_PTR:
        std::cout << "assign_ptr: " << std::dec << (uint16_t)asAssignmentIndex() << " " << asIndex();
        return;

    case THIS:
        std::cout << "this";
        return;

    case VIEW:
        std::cout << "view";
        return;

    case MKS:
        std::cout << "mks";
        return;

    case VWS:
        std::cout << "vws";
        return;

    case NODE:
        std::cout << "nid: " << std::dec << (uint32_t)getNodeID();
        return;

    case DEVICE:
        std::cout << "did: " << std::dec << (uint32_t)getNodeID() << " " << (uint32_t)getClassID() << " " << (uint32_t)getDeviceID();
        return;

    case DEVICE_FUNCTION:
        std::cout << "fid: " << std::dec << asOpcode();
        return;

    case C_PTR:
        std::cout << "cptr: " << std::dec << (uint16_t)getAtomCount();
        Members_to_go = getAtomCount();
        return;

    case SET:
        std::cout << "set: " << std::dec << (uint16_t)getAtomCount();
        Members_to_go = getAtomCount();
        return;

    case OBJECT:
        std::cout << "obj: " << std::dec << asOpcode() << " " << (uint16_t)getAtomCount();
        Members_to_go = getAtomCount();
        return;

    case S_SET:
        std::cout << "s_set: " << std::dec << asOpcode() << " " << (uint16_t)getAtomCount();
        Members_to_go = getAtomCount();
        return;

    case MARKER:
        std::cout << "mk: " << std::dec << asOpcode() << " " << (uint16_t)getAtomCount();
        Members_to_go = getAtomCount();
        return;

    case OPERATOR:
        std::cout << "op: " << std::dec << asOpcode() << " " << (uint16_t)getAtomCount();
        Members_to_go = getAtomCount();
        return;

    case STRING:
        std::cout << "st: " << std::dec << (uint16_t)getAtomCount();
        Members_to_go = String_data = getAtomCount();
        Char_count = (atom & 0x000000FF);
        return;

    case TIMESTAMP:
        std::cout << "us";
        Members_to_go = Timestamp_data = 2;
        return;

    case GROUP:
        std::cout << "grp: " << std::dec << asOpcode() << " " << (uint16_t)getAtomCount();
        Members_to_go = getAtomCount();
        return;

    case INSTANTIATED_PROGRAM:
    case INSTANTIATED_ANTI_PROGRAM:
    case INSTANTIATED_INPUT_LESS_PROGRAM:
        std::cout << "ipgm: " << std::dec << asOpcode() << " " << (uint16_t)getAtomCount();
        Members_to_go = getAtomCount();
        return;

    case COMPOSITE_STATE:
        std::cout << "cst: " << std::dec << asOpcode() << " " << (uint16_t)getAtomCount();
        Members_to_go = getAtomCount();
        return;

    case MODEL:
        std::cout << "mdl: " << std::dec << asOpcode() << " " << (uint16_t)getAtomCount();
        Members_to_go = getAtomCount();
        return;

    case NULL_PROGRAM:
        std::cout << "null pgm " << (takesPastInputs() ? "all inputs" : "new inputs");
        return;

    default:
        if (Timestamp_data) {
            --Timestamp_data;
            std::cout << atom;
        } else if (String_data) {
            --String_data;
            std::string s;
            char *content = (char *)&atom;

            for (uint8_t i = 0; i < 4; ++i) {
                if (Char_count-- > 0) {
                    s += content[i];
                } else {
                    break;
                }
            }

            std::cout << s.c_str();
        } else if (isFloat()) {
            std::cout << "nb: " << std::dec << asFloat();
            return;
        } else {
            std::cout << "undef";
        }

        return;
    }
}